

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Icon.cxx
# Opt level: O0

void __thiscall
Fl_File_Icon::draw(Fl_File_Icon *this,int x,int y,int w,int h,Fl_Color ic,int active)

{
  int iVar1;
  short *psVar2;
  Fl_Color FVar3;
  double dVar4;
  int local_5c;
  double scale;
  short *prim;
  short *dend;
  short *d;
  Fl_Color local_28;
  Fl_Color oc;
  Fl_Color c;
  Fl_Color ic_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  Fl_File_Icon *this_local;
  
  if (this->num_data_ != 0) {
    local_5c = h;
    if (w < h) {
      local_5c = w;
    }
    dVar4 = (double)local_5c;
    fl_push_matrix();
    fl_translate(((double)w - dVar4) * 0.5 + (double)x,((double)h + dVar4) * 0.5 + (double)y);
    fl_scale(dVar4,-dVar4);
    dend = this->data_;
    psVar2 = this->data_;
    iVar1 = this->num_data_;
    scale = 0.0;
    local_28 = ic;
    if (active == 0) {
      FVar3 = fl_inactive(ic);
      fl_color(FVar3);
    }
    else {
      fl_color(ic);
    }
    while (dend < psVar2 + iVar1) {
      switch(*dend) {
      case 0:
        if (scale != 0.0) {
          switch(*(undefined2 *)scale) {
          case 2:
            fl_end_line();
            break;
          case 3:
            fl_end_loop();
            break;
          case 4:
            fl_end_complex_polygon();
            break;
          case 5:
            fl_end_complex_polygon();
            FVar3 = CONCAT22(*(undefined2 *)((long)scale + 2),*(undefined2 *)((long)scale + 4));
            if (active == 0) {
              if (FVar3 == 0xffffffff) {
                FVar3 = fl_inactive(ic);
                fl_color(FVar3);
              }
              else {
                FVar3 = fl_inactive(FVar3);
                fl_color(FVar3);
              }
            }
            else if (FVar3 == 0xffffffff) {
              fl_color(ic);
            }
            else {
              fl_color(FVar3);
            }
            fl_begin_loop();
            dVar4 = scale;
            while (scale = (double)((long)dVar4 + 6), *(short *)scale == 6) {
              fl_vertex((double)(int)*(short *)((long)dVar4 + 8) * 0.0001,
                        (double)(int)*(short *)((long)dVar4 + 10) * 0.0001);
              dVar4 = scale;
            }
            fl_end_loop();
            fl_color(local_28);
          }
        }
        scale = 0.0;
        dend = dend + 1;
        break;
      case 1:
        local_28 = CONCAT22(dend[1],dend[2]);
        if (local_28 == 0xffffffff) {
          local_28 = ic;
        }
        if (active == 0) {
          local_28 = fl_inactive(local_28);
        }
        fl_color(local_28);
        dend = dend + 3;
        break;
      case 2:
        scale = (double)dend;
        dend = dend + 1;
        fl_begin_line();
        break;
      case 3:
        scale = (double)dend;
        dend = dend + 1;
        fl_begin_loop();
        break;
      case 4:
        scale = (double)dend;
        dend = dend + 1;
        fl_begin_complex_polygon();
        break;
      case 5:
        scale = (double)dend;
        dend = dend + 3;
        fl_begin_complex_polygon();
        break;
      case 6:
        if (scale != 0.0) {
          fl_vertex((double)(int)dend[1] * 0.0001,(double)(int)dend[2] * 0.0001);
        }
        dend = dend + 3;
        break;
      default:
        dend = dend + 1;
      }
    }
    if (scale != 0.0) {
      switch(*(undefined2 *)scale) {
      case 2:
        fl_end_line();
        break;
      case 3:
        fl_end_loop();
        break;
      case 4:
        fl_end_polygon();
        break;
      case 5:
        fl_end_polygon();
        FVar3 = CONCAT22(*(undefined2 *)((long)scale + 2),*(undefined2 *)((long)scale + 4));
        if (active == 0) {
          if (FVar3 == 0xffffffff) {
            FVar3 = fl_inactive(ic);
            fl_color(FVar3);
          }
          else {
            FVar3 = fl_inactive(FVar3);
            fl_color(FVar3);
          }
        }
        else if (FVar3 == 0xffffffff) {
          fl_color(ic);
        }
        else {
          fl_color(FVar3);
        }
        fl_begin_loop();
        dVar4 = scale;
        while (scale = (double)((long)dVar4 + 6), *(short *)scale == 6) {
          fl_vertex((double)(int)*(short *)((long)dVar4 + 8) * 0.0001,
                    (double)(int)*(short *)((long)dVar4 + 10) * 0.0001);
          dVar4 = scale;
        }
        fl_end_loop();
        fl_color(local_28);
      }
    }
    fl_pop_matrix();
  }
  return;
}

Assistant:

void
Fl_File_Icon::draw(int      x,		// I - Upper-lefthand X
        	   int      y,		// I - Upper-lefthand Y
		   int      w,		// I - Width of bounding box
		   int      h,		// I - Height of bounding box
        	   Fl_Color ic,		// I - Icon color...
        	   int      active)	// I - Active or inactive?
{
  Fl_Color	c,		// Current color
		oc;		// Outline color
  short		*d,		// Pointer to data
		*dend;		// End of data...
  short		*prim;		// Pointer to start of primitive...
  double	scale;		// Scale of icon


  // Don't try to draw a NULL array!
  if (num_data_ == 0)
    return;

  // Setup the transform matrix as needed...
  scale = w < h ? w : h;

  fl_push_matrix();
  fl_translate((float)x + 0.5 * ((float)w - scale),
               (float)y + 0.5 * ((float)h + scale));
  fl_scale(scale, -scale);

  // Loop through the array until we see an unmatched END...
  d    = data_;
  dend = data_ + num_data_;
  prim = NULL;
  c    = ic;

  if (active)
    fl_color(c);
  else
    fl_color(fl_inactive(c));

  while (d < dend)
    switch (*d)
    {
      case END :
          if (prim)
            switch (*prim)
	    {
	      case LINE :
		  fl_end_line();
		  break;

	      case CLOSEDLINE :
		  fl_end_loop();
		  break;

	      case POLYGON :
		  fl_end_complex_polygon();
		  break;

	      case OUTLINEPOLYGON :
		  fl_end_complex_polygon();

        	  oc = (Fl_Color)((((unsigned short *)prim)[1] << 16) | 
	                	  ((unsigned short *)prim)[2]);
                  if (active)
		  {
                    if (oc == FL_ICON_COLOR)
		      fl_color(ic);
		    else
		      fl_color(oc);
		  }
		  else
		  {
                    if (oc == FL_ICON_COLOR)
		      fl_color(fl_inactive(ic));
		    else
		      fl_color(fl_inactive(oc));
		  }

		  fl_begin_loop();

		  prim += 3;
		  while (*prim == VERTEX)
		  {
		    fl_vertex(prim[1] * 0.0001, prim[2] * 0.0001);
		    prim += 3;
		  }

        	  fl_end_loop();
		  fl_color(c);
		  break;
	    }

          prim = NULL;
	  d ++;
	  break;

      case COLOR :
          c = (Fl_Color)((((unsigned short *)d)[1] << 16) | 
	                   ((unsigned short *)d)[2]);

          if (c == FL_ICON_COLOR)
	    c = ic;

          if (!active)
	    c = fl_inactive(c);

          fl_color(c);
	  d += 3;
	  break;

      case LINE :
          prim = d;
	  d ++;
	  fl_begin_line();
	  break;

      case CLOSEDLINE :
          prim = d;
	  d ++;
	  fl_begin_loop();
	  break;

      case POLYGON :
          prim = d;
	  d ++;
	  fl_begin_complex_polygon();
	  break;

      case OUTLINEPOLYGON :
          prim = d;
	  d += 3;
	  fl_begin_complex_polygon();
	  break;

      case VERTEX :
          if (prim)
	    fl_vertex(d[1] * 0.0001, d[2] * 0.0001);
	  d += 3;
	  break;

      default : // Ignore invalid data...
          d ++;
    }

  // If we still have an open primitive, close it...
  if (prim)
    switch (*prim)
    {
      case LINE :
	  fl_end_line();
	  break;

      case CLOSEDLINE :
	  fl_end_loop();
	  break;

      case POLYGON :
	  fl_end_polygon();
	  break;

      case OUTLINEPOLYGON :
	  fl_end_polygon();

          oc = (Fl_Color)((((unsigned short *)prim)[1] << 16) | 
	                  ((unsigned short *)prim)[2]);
          if (active)
	  {
            if (oc == FL_ICON_COLOR)
	      fl_color(ic);
	    else
	      fl_color(oc);
	  }
	  else
	  {
            if (oc == FL_ICON_COLOR)
	      fl_color(fl_inactive(ic));
	    else
	      fl_color(fl_inactive(oc));
	  }

	  fl_begin_loop();

	  prim += 3;
	  while (*prim == VERTEX)
	  {
	    fl_vertex(prim[1] * 0.0001, prim[2] * 0.0001);
	    prim += 3;
	  }

          fl_end_loop();
	  fl_color(c);
	  break;
    }

  // Restore the transform matrix
  fl_pop_matrix();
}